

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O3

void pputrast(char *fn,uchar *hd,float *bf,int sx,int sy,int r)

{
  uint __fd;
  int iVar1;
  ssize_t sVar2;
  ulong uVar3;
  int extraout_EDX;
  ulong uVar4;
  int iVar5;
  uchar *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 extraout_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  uchar c;
  uchar local_45;
  uint local_44;
  ulong local_40;
  long local_38;
  
  puVar6 = (uchar *)0x180;
  local_44 = sx;
  __fd = creat(fn,0x180);
  if ((int)__fd < 1) {
LAB_00102fe1:
    pputrast_cold_1();
  }
  else {
    fn = (char *)(ulong)__fd;
    sVar2 = write(__fd,hd,0x20);
    puVar6 = hd;
    if (sVar2 == 0x20) {
      if (0 < sy) {
        uVar3 = (ulong)(uint)sy;
        uVar4 = (ulong)local_44;
        local_38 = (long)r << 2;
        uVar11 = 0;
        local_40 = uVar3;
        do {
          if (0 < (int)local_44) {
            uVar10 = 0;
            do {
              local_45 = (uchar)(int)bf[uVar10];
              fn = (char *)(ulong)__fd;
              puVar6 = &local_45;
              sVar2 = write(__fd,&local_45,1);
              sx = (int)uVar3;
              if (sVar2 != 1) {
                pputrast_cold_3();
                goto LAB_00102fe1;
              }
              uVar10 = uVar10 + 1;
            } while (uVar4 != uVar10);
          }
          uVar11 = uVar11 + 1;
          bf = (float *)((long)bf + local_38);
        } while (uVar11 != local_40);
      }
      close(__fd);
      return;
    }
  }
  pputrast_cold_2();
  if (0 < sx) {
    iVar1 = 0;
    do {
      iVar9 = *(int *)fn;
      iVar7 = extraout_EDX;
      iVar8 = sx;
      do {
        iVar5 = (int)puVar6;
        *(undefined8 *)(*(long *)((long)fn + 0x158) + (long)(iVar9 * iVar5 + iVar7) * 8) =
             extraout_XMM0_Qa;
        iVar9 = *(int *)fn;
        *(ulong *)(*(long *)((long)fn + ((long)(*(int *)((long)fn + 0xc) / 2) * 2 + 0x2e) * 4) +
                   0x24 + (long)(iVar5 * iVar9 + iVar7) * 0x30) =
             CONCAT44((float)in_XMM2_Qa,(float)(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
        iVar7 = iVar7 + 1;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      iVar1 = iVar1 + 1;
      puVar6 = (uchar *)(ulong)(iVar5 + 1);
    } while (iVar1 != sx);
  }
  return;
}

Assistant:

void pputrast(fn,hd,bf,sx,sy,r)
char *fn ;
unsigned char hd[H] ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = creat(fn,0600)) > 0) { ;
    if (write(fd,hd,H) == H) {
      for (i = 0 ; i < sy ; i++) {
        for (j = 0 ; j < sx ; j++) {
          c = (unsigned char)bf[r*i + j] ;
          if (write(fd,&c,sizeof(c)) != 1) {
            error(7) ;
          }
        }
      }
    }
    else {
      error(8) ;
    }
  }
  else {
    error(9) ;
  }
  close(fd) ;
}